

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# replay.cpp
# Opt level: O2

bool __thiscall Replay::skip_until_nmi(Replay *this,uint32_t target_skip_nmi)

{
  uint8_t *puVar1;
  ulong uVar2;
  bool bVar3;
  FILE *pFVar4;
  size_t in_RCX;
  size_t __nbytes;
  char *__s;
  long lVar5;
  BigFile local_98;
  TraceSkip msg;
  TraceCacheHeader header;
  
  local_98._offset = 0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&header,
                 &this->_trace_file_name,".emulation_cache");
  pFVar4 = fopen((char *)header.magic,"rb");
  local_98._file = (FILE *)pFVar4;
  std::__cxx11::string::~string((string *)&header);
  if (pFVar4 == (FILE *)0x0) goto LAB_0013ccf3;
  header.magic = 0x534e535443414348;
  snestistics::BigFile::read(&local_98,(int)&header,(void *)0x2c,in_RCX);
  if (header.version == 4) {
    if (target_skip_nmi < header.num_nmis) {
      __s = "Emulation cache does not have enough NMIs, not using";
      goto LAB_0013cce4;
    }
    uVar2 = (ulong)target_skip_nmi / (ulong)header.nmi_per_skip;
    snestistics::BigFile::set_offset(&local_98,uVar2 * 0x20027 + header.replay_cache_seek_offset);
    snestistics::BigFile::read(&local_98,(int)&msg,(void *)0x27,in_RCX);
    if (target_skip_nmi < msg.nmi) {
      __assert_fail("msg.nmi <= target_skip_nmi",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/replay.cpp"
                    ,0xa8,"bool Replay::skip_until_nmi(const uint32_t)");
    }
    (this->regs)._A = msg.regs.A;
    (this->regs)._X = msg.regs.X;
    (this->regs)._Y = msg.regs.Y;
    (this->regs)._S = msg.regs.S;
    (this->regs)._DB = msg.regs.DB;
    (this->regs)._DP = msg.regs.DP;
    (this->regs)._PC = (uint)CONCAT12(msg.regs.pc_bank,msg.regs.pc_address);
    (this->regs)._P = msg.regs.P;
    __nbytes = (size_t)(uint)CONCAT12(msg.regs.wram_bank,msg.regs.wram_address);
    (this->regs)._WRAM = (uint)CONCAT12(msg.regs.wram_bank,msg.regs.wram_address);
    for (lVar5 = 0; puVar1 = (this->regs)._memory, lVar5 != 0x1000000; lVar5 = lVar5 + 0x10000) {
      memset(puVar1 + lVar5,0,0x8000);
    }
    snestistics::BigFile::read(&local_98,(int)puVar1 + 0x7e0000,(void *)0x10000,__nbytes);
    snestistics::BigFile::read
              (&local_98,(int)(this->regs)._memory + 0x7f0000,(void *)0x10000,__nbytes);
    if (uVar2 * header.nmi_per_skip - (ulong)msg.nmi != 0) {
      __assert_fail("msg.nmi == skip * nmi_per_skip",
                    "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/replay.cpp"
                    ,0xbb,"bool Replay::skip_until_nmi(const uint32_t)");
    }
    this->_current_nmi = msg.nmi;
    snestistics::BigFile::set_offset(&this->_trace_file,msg.seek_offset_trace_file);
    this->_current_op = msg.current_op;
    this->_accumulated_op_counter = msg.current_op - 1;
    read_next_event(this);
    if ((this->_trace_helper)._file != (FILE *)0x0) {
      snestistics::BigFile::set_offset(&this->_trace_helper,this->_current_op * 0x2f);
    }
  }
  else {
    __s = "Emulation cache has wrong version, not using";
LAB_0013cce4:
    puts(__s);
  }
  fclose((FILE *)local_98._file);
LAB_0013ccf3:
  if (target_skip_nmi < this->_current_nmi) {
    __assert_fail("_current_nmi <= target_skip_nmi",
                  "/workspace/llm4binary/github/license_c_cmakelists/breakin[P]snestistics/source/replay.cpp"
                  ,0xce,"bool Replay::skip_until_nmi(const uint32_t)");
  }
  bVar3 = true;
  if (this->_current_nmi != target_skip_nmi) {
    do {
      if (((this->_current_nmi == target_skip_nmi) && (this->_current_op == this->_next_event_op))
         && ((this->_next_event).type == EVENT_NMI)) {
        return true;
      }
      bVar3 = next(this);
    } while (bVar3);
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool Replay::skip_until_nmi(const uint32_t target_skip_nmi) {

	EmulateRegisters &regs = this->regs;

	// TODO: If we are running without skip-cache we can't go back! Fix, or require skip cache...

	// Use skip file if it exists!
	// Note: Currently we can only skip to the point right AFTER an NMI so we do one nmi too little here
	// Using do/while here is a bit bananas but helps with indentation :)
	do {
		BigFile f;
		{
			std::string filename = _trace_file_name + ".emulation_cache";
			f._file = fopen(filename.c_str(), "rb"); // The 0 here must be wrong if we do many
		}
		if (!f._file)
			break;

		snestistics::TraceCacheHeader header;
		f.read(&header, sizeof(header));

		// TODO: Test again trace hash as well for sanity?

		if (header.version != TRACE_CACHE_VERSION) {
			printf("Emulation cache has wrong version, not using\n");
			fclose(f._file);
			break;
		}

		if(target_skip_nmi < header.num_nmis) {
			printf("Emulation cache does not have enough NMIs, not using\n");
			fclose(f._file);
			break;
		}

		const uint32_t nmi_per_skip = header.nmi_per_skip;

		// Since skip information is to get AFTER an nmi just happened, we skip to the frame before
		// We use emulation to get to the before NMI case
		uint64_t skip = (target_skip_nmi) / nmi_per_skip;
		f.set_offset(skip * snestistics::trace_skip_total_size + header.replay_cache_seek_offset);

		snestistics::TraceSkip msg;
		f.read(&msg, sizeof(msg));
		assert(msg.nmi <= target_skip_nmi);

		// TODO: Don't leak STATE implementation like this
		regs._A  = msg.regs.A;
		regs._X  = msg.regs.X;
		regs._Y  = msg.regs.Y;
		regs._S  = msg.regs.S;
		regs._DB = msg.regs.DB;
		regs._DP = msg.regs.DP;
		regs._PC = (msg.regs.pc_bank<<16)|msg.regs.pc_address;
		regs._P  = msg.regs.P;
		regs._WRAM = (msg.regs.wram_bank<<16)|msg.regs.wram_address;

		for (int bank=0; bank<256; bank++)
			memset(&regs._memory[bank*64*1024], 0, 0x8000);

		f.read(&regs._memory[0x7E0000], 1024*64);
		f.read(&regs._memory[0x7F0000], 1024*64);

		assert(msg.nmi == skip * nmi_per_skip);

		_current_nmi = msg.nmi;
		_trace_file.set_offset(msg.seek_offset_trace_file);

		_current_op = msg.current_op;
		_accumulated_op_counter = msg.current_op-1;

		read_next_event();

		#ifdef VERIFY_OPS
			if (_trace_helper._file) {
				uint64_t helper_pos = _current_op * (sizeof(snestistics::HelperType)+sizeof(snestistics::HelperOp));
				_trace_helper.set_offset(helper_pos);
			}
		#endif
		fclose(f._file);
	} while (false);

	CUSTOM_ASSERT(_current_nmi <= target_skip_nmi);

	if (_current_nmi == target_skip_nmi) // We had a skip for the exact right nmi
		return true;

	// TODO: We might have to re-emulate from start if there was no skip and we want to go to same frame or less
	// Skips are not for every nmi so make sure we reach the right one
	while (true) {
		if (target_skip_nmi == _current_nmi && _current_op == _next_event_op && _next_event.type == TraceEventType::EVENT_NMI)
			return true;
		if (!next())
			return false;
	}
}